

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_ManPatDistImprove(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vTotal;
  Vec_Int_t *vPat;
  Vec_Int_t *vThis;
  Gia_Man_t *vThis_00;
  long lVar4;
  Gia_Man_t *p_00;
  int nWords;
  uint Iter;
  uint uVar5;
  Vec_Wrd_t *vPatterns;
  double dVar6;
  double dVar7;
  timespec ts;
  uint local_84;
  double local_80;
  double local_78;
  long local_60;
  timespec local_48;
  Vec_Wrd_t *local_38;
  
  nWords = p->vSimsPi->nSize / p->vCis->nSize;
  vTotal = Gia_SimGenerateStats(p);
  vPatterns = p->vSimsPi;
  p->vSimsPi = (Vec_Wrd_t *)0x0;
  Abc_Random(1);
  uVar1 = nWords * 0x40;
  if (nWords < 1) {
    local_80 = 0.0;
    local_78 = 0.0;
  }
  else {
    uVar5 = 1;
    if (1 < (int)uVar1) {
      uVar5 = uVar1;
    }
    local_78 = 0.0;
    local_84 = 0;
    local_80 = 0.0;
    local_38 = vPatterns;
    do {
      iVar2 = clock_gettime(3,&local_48);
      if (iVar2 < 0) {
        local_60 = 1;
      }
      else {
        lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
        local_60 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_48.tv_sec * -1000000;
      }
      vPat = Gia_ManPatCollectOne(p,vPatterns,local_84,nWords);
      vThis = Gia_SimQualityOne(p,vPat,0);
      dVar6 = Gia_SimComputeScore(p,vTotal,vThis);
      if (vThis->pArray != (int *)0x0) {
        free(vThis->pArray);
        vThis->pArray = (int *)0x0;
      }
      if (vThis != (Vec_Int_t *)0x0) {
        free(vThis);
      }
      local_78 = local_78 + dVar6;
      Iter = 0;
      do {
        uVar3 = Gia_SimQualityPatternsMax(p,vPat,Iter,fVerbose,vTotal);
        if (uVar3 == 0xffffffff) goto LAB_007be9ef;
        if (((int)uVar3 < 0) || (p->vCis->nSize <= (int)uVar3)) {
          __assert_fail("MaxIn >= 0 && MaxIn < Gia_ManCiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                        ,0x6db,"void Gia_ManPatDistImprove(Gia_Man_t *, int)");
        }
        vPat->pArray[uVar3] = vPat->pArray[uVar3] ^ 1;
        if (uVar3 == 0xffffffff) goto LAB_007be9ef;
        Iter = Iter + 1;
      } while (Iter != 100);
      Iter = 100;
LAB_007be9ef:
      vThis_00 = (Gia_Man_t *)Gia_SimQualityOne(p,vPat,0);
      dVar7 = Gia_SimComputeScore(p,vTotal,(Vec_Int_t *)vThis_00);
      p_00 = (Gia_Man_t *)vThis_00->pSpec;
      if (p_00 != (Gia_Man_t *)0x0) {
        free(p_00);
        vThis_00->pSpec = (char *)0x0;
      }
      if (vThis_00 != (Gia_Man_t *)0x0) {
        free(vThis_00);
        p_00 = vThis_00;
      }
      vPatterns = local_38;
      if (fVerbose != 0) {
        printf("Pat %5d : Tries = %5d  InitValue = %6.3f  FinalValue = %6.3f  Ratio = %4.2f  ",dVar6
               ,dVar7,dVar7 / dVar6,(ulong)local_84,(ulong)Iter);
        p_00 = (Gia_Man_t *)0x3;
        iVar2 = clock_gettime(3,&local_48);
        if (iVar2 < 0) {
          lVar4 = -1;
        }
        else {
          lVar4 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        Abc_Print((int)p_00,"%s =","Time");
        Abc_Print((int)p_00,"%9.2f sec\n",(double)(lVar4 + local_60) / 1000000.0);
      }
      Gia_ManPatUpdateOne(p_00,vPatterns,local_84,nWords,vPat);
      if (vPat->pArray != (int *)0x0) {
        free(vPat->pArray);
        vPat->pArray = (int *)0x0;
      }
      if (vPat != (Vec_Int_t *)0x0) {
        free(vPat);
      }
      local_80 = local_80 + dVar7;
      local_84 = local_84 + 1;
    } while (local_84 != uVar5);
  }
  if (vTotal->pArray != (int *)0x0) {
    free(vTotal->pArray);
    vTotal->pArray = (int *)0x0;
  }
  if (vTotal != (Vec_Int_t *)0x0) {
    free(vTotal);
  }
  if (fVerbose != 0) {
    putchar(10);
  }
  printf("Improved %d patterns with average init value %.2f and average final value %.2f.\n",
         local_78 / (double)(int)uVar1,local_80 / (double)(int)uVar1);
  p->vSimsPi = vPatterns;
  return;
}

Assistant:

void Gia_ManPatDistImprove( Gia_Man_t * p, int fVerbose )
{
    int n, k, nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    double InitValue, InitTotal = 0, FinalValue, FinalTotal = 0;
    Vec_Int_t * vPat, * vRes, * vStats = Gia_SimGenerateStats( p );
    Vec_Wrd_t * vPatterns = p->vSimsPi; p->vSimsPi = NULL;
    Abc_Random(1);
    for ( n = 0; n < 64*nWords; n++ )
    {
        abctime clk = Abc_Clock();
//        if ( n == 32 )
//            break;

        vPat = Gia_ManPatCollectOne( p, vPatterns, n, nWords );
        vRes = Gia_SimQualityOne( p, vPat, 0 );
        InitValue = Gia_SimComputeScore(p, vStats, vRes);
        InitTotal += InitValue;
        Vec_IntFree( vRes );

        for ( k = 0; k < 100; k++ )
        {
            int MaxIn = Gia_SimQualityPatternsMax( p, vPat, k, fVerbose, vStats );
            if ( MaxIn == -1 )
                break;
            assert( MaxIn >= 0 && MaxIn < Gia_ManCiNum(p) );
            Vec_IntArray(vPat)[MaxIn] ^= 1;            
        }
        //Vec_IntPrint( vPat );

        vRes = Gia_SimQualityOne( p, vPat, 0 );
        FinalValue = Gia_SimComputeScore(p, vStats, vRes);
        FinalTotal += FinalValue;
        Vec_IntFree( vRes );

        if ( fVerbose )
        {
            printf( "Pat %5d : Tries = %5d  InitValue = %6.3f  FinalValue = %6.3f  Ratio = %4.2f  ", 
                n, k, InitValue, FinalValue, FinalValue/InitValue );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }

        Gia_ManPatUpdateOne( p, vPatterns, n, nWords, vPat );
        Vec_IntFree( vPat );
    }
    Vec_IntFree( vStats );
    if ( fVerbose )
        printf( "\n" );
    printf( "Improved %d patterns with average init value %.2f and average final value %.2f.\n", 
        64*nWords, 1.0*InitTotal/(64*nWords), 1.0*FinalTotal/(64*nWords) );
    p->vSimsPi = vPatterns;
}